

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeForces::getSelfInteraction
          (FluctuatingChargeForces *this,int atid,RealType charge,RealType *potential,
          RealType *force)

{
  reference pvVar1;
  double *in_RCX;
  double *in_RDX;
  int in_ESI;
  FluctuatingChargeForces *in_RDI;
  double dVar2;
  DoublePolynomial vself;
  FluctuatingChargeAtomData *in_stack_ffffffffffffff68;
  FluctuatingChargeAtomData *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff98;
  Polynomial<double> *in_stack_ffffffffffffffa0;
  
  if ((in_RDI->initialized_ & 1U) == 0) {
    initialize(in_RDI);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->FQtids,(long)in_ESI);
  std::vector<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  ::operator[](&in_RDI->FQMap,(long)*pvVar1);
  FluctuatingChargeAtomData::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Polynomial<double>::Polynomial
            ((Polynomial<double> *)in_stack_ffffffffffffff70,
             (Polynomial<double> *)in_stack_ffffffffffffff68);
  dVar2 = Polynomial<double>::evaluate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RDX = *in_RDX + dVar2;
  dVar2 = Polynomial<double>::evaluateDerivative
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RCX = *in_RCX - dVar2;
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x421ae2);
  return;
}

Assistant:

void FluctuatingChargeForces::getSelfInteraction(int atid, RealType charge,
                                                   RealType& potential,
                                                   RealType& force) {
    if (!initialized_) initialize();

    data = FQMap[FQtids[atid]];

    DoublePolynomial vself = data.vself_;
    potential += vself.evaluate(charge);
    force -= vself.evaluateDerivative(charge);

    return;
  }